

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMove6<(moira::Instr)71,(moira::Mode)0,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  u32 *in_RDX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Ea<(moira::Mode)6,_(moira::Size)2> dst;
  Ea<(moira::Mode)0,_(moira::Size)2> src;
  undefined4 in_stack_ffffffffffffffb0;
  Align align;
  Ea<(moira::Mode)0,_(moira::Size)2> *in_stack_ffffffffffffffb8;
  StrWriter *in_stack_ffffffffffffffc0;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  
  Op<(moira::Mode)0,(moira::Size)2>
            ((Ea<(moira::Mode)0,_(moira::Size)2> *)&stack0xffffffffffffffd0,in_RDI,in_CX & 7,in_RDX)
  ;
  Op<(moira::Mode)6,(moira::Size)2>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,(u32 *)in_stack_ffffffffffffffc0);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  align.raw = (in_RDI->tab).raw;
  StrWriter::operator<<(pSVar1,align);
  pSVar1 = StrWriter::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT44(align.raw,in_stack_ffffffffffffffb0),
             (Ea<(moira::Mode)6,_(moira::Size)2> *)in_RDI);
  return;
}

Assistant:

void
Moira::dasmMove6(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_IX,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}